

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerDropout.cpp
# Opt level: O2

void __thiscall tfs::DnnLayerDropout::setup(DnnLayerDropout *this,bool trainable)

{
  Matrix *pMVar1;
  ulong uVar2;
  TMatrix<double> *this_00;
  TMatrix<double> *pTVar3;
  bool *pbVar4;
  unsigned_long ii;
  ulong uVar5;
  char *format;
  unsigned_long uStack_30;
  
  pTVar3 = (this->super_DnnLayer).m_in_a;
  if (((pTVar3 == (TMatrix<double> *)0x0) || (pTVar3->m_data == (double *)0x0)) ||
     (pTVar3->m_end < pTVar3->m_data)) {
    format = "Input activation matrix is bad";
    uStack_30 = 0x27;
  }
  else {
    if ((!trainable) || (pMVar1 = (this->super_DnnLayer).m_in_dw, pMVar1 == (Matrix *)0x0)) {
LAB_00114965:
      this_00 = (TMatrix<double> *)operator_new(0x50);
      TMatrix<double>::TMatrix(this_00,pTVar3,false);
      (this->super_DnnLayer).m_out_a = this_00;
      if (trainable) {
        pTVar3 = (TMatrix<double> *)operator_new(0x50);
        TMatrix<double>::TMatrix(pTVar3,this_00,false);
        (this->super_DnnLayer).m_out_dw = pTVar3;
        this_00 = (this->super_DnnLayer).m_out_a;
      }
      uVar2 = this_00->m_count;
      pbVar4 = (bool *)operator_new__(uVar2);
      this->m_dropped = pbVar4;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        pbVar4[uVar5] = false;
      }
      return;
    }
    if ((pMVar1->m_data == (double *)0x0) || (pMVar1->m_end < pMVar1->m_data)) {
      format = "Input dw matrix is bad";
      uStack_30 = 0x2c;
    }
    else {
      if (pTVar3->m_count == pMVar1->m_count) goto LAB_00114965;
      format = "in_a != in_dw size";
      uStack_30 = 0x30;
    }
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerDropout.cpp"
                 ,"setup",uStack_30,format);
  return;
}

Assistant:

void
    DnnLayerDropout::setup( const bool trainable ) {
        // -----------------------------------------------------------------------------------
        // S = size of input data
        // out_a[S]  = activations of each neuron
        // out_dw[S] = gradient
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a )) {
            log_error( "Input activation matrix is bad" );
            return;
        }
        if( trainable && m_in_dw != 0 ) {       // Input layers can have null m_out_dw
            if( matrixBad( m_in_dw )) {
                log_error( "Input dw matrix is bad" );
                return;
            }
            if( m_in_a->count() != m_in_dw->count()) {  // By default, we expect the dimensions to be the same.
                log_error( "in_a != in_dw size" );
                return;
            }
        }
        m_out_a = new Matrix( *m_in_a );         // Output dimension matches input dimension
        if( trainable ) {
            m_out_dw = new Matrix( *m_out_a );   // Output dimension matches input dimension
        }
        const unsigned long count = m_out_a->count();
        m_dropped = new bool[ count ];
        for( unsigned long ii = 0; ii < count; ii++ ) {
            m_dropped[ii] = false;
        }
        return;
    }